

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O2

CameraParameters * polyscope::view::getCameraParametersForCurrentView(void)

{
  CameraParameters *in_RDI;
  ulong in_XMM0_Qa;
  undefined1 auVar2 [56];
  undefined1 auVar1 [64];
  CameraIntrinsics CVar3;
  float local_70;
  float local_6c;
  CameraIntrinsics local_68;
  CameraExtrinsics local_5c;
  
  ensureViewValid();
  local_70 = (float)bufferWidth / (float)bufferHeight;
  auVar2 = ZEXT856(in_XMM0_Qa);
  local_6c = (float)fov;
  CVar3 = CameraIntrinsics::fromFoVDegVerticalAndAspect(&local_6c,&local_70);
  auVar1._0_8_ = CVar3._0_8_;
  auVar1._8_56_ = auVar2;
  local_68._0_8_ = vmovlps_avx(auVar1._0_16_);
  local_68.isValidFlag = CVar3.isValidFlag;
  CameraExtrinsics::fromMatrix(&local_5c,(mat4 *)&viewMat);
  CameraParameters::CameraParameters(in_RDI,&local_68,&local_5c);
  return in_RDI;
}

Assistant:

CameraParameters getCameraParametersForCurrentView() {
  ensureViewValid();

  double aspectRatio = (float)bufferWidth / bufferHeight;
  return CameraParameters(CameraIntrinsics::fromFoVDegVerticalAndAspect(fov, aspectRatio),
                          CameraExtrinsics::fromMatrix(viewMat));
}